

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS
ref_metric_eig_bal(REF_DBL *metric,REF_GRID ref_grid,REF_DBL *scalar,
                  REF_RECON_RECONSTRUCTION reconstruction,REF_INT p_norm,REF_DBL gradation,
                  REF_DBL target_complexity)

{
  uint uVar1;
  undefined8 uVar2;
  char *pcVar3;
  
  uVar1 = ref_recon_hessian(ref_grid,scalar,metric,reconstruction);
  if (uVar1 == 0) {
    uVar1 = ref_recon_roundoff_limit(metric,ref_grid);
    if (uVar1 == 0) {
      uVar1 = ref_metric_histogram(metric,ref_grid,"hess.tec");
      if (uVar1 == 0) {
        uVar1 = ref_metric_local_scale(metric,ref_grid,p_norm);
        if (uVar1 == 0) {
          uVar1 = ref_metric_gradation_at_complexity(metric,ref_grid,gradation,target_complexity);
          if (uVar1 == 0) {
            return 0;
          }
          pcVar3 = "gradation at complexity";
          uVar2 = 0xa12;
        }
        else {
          pcVar3 = "local scale lp norm";
          uVar2 = 0xa0f;
        }
      }
      else {
        pcVar3 = "histogram";
        uVar2 = 0xa0e;
      }
    }
    else {
      pcVar3 = "floor metric eigenvalues based on grid size and solution jitter";
      uVar2 = 0xa0d;
    }
  }
  else {
    pcVar3 = "recon";
    uVar2 = 0xa0b;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar2,
         "ref_metric_eig_bal",(ulong)uVar1,pcVar3);
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_metric_eig_bal(REF_DBL *metric, REF_GRID ref_grid,
                                      REF_DBL *scalar,
                                      REF_RECON_RECONSTRUCTION reconstruction,
                                      REF_INT p_norm, REF_DBL gradation,
                                      REF_DBL target_complexity) {
  RSS(ref_recon_hessian(ref_grid, scalar, metric, reconstruction), "recon");
  RSS(ref_recon_roundoff_limit(metric, ref_grid),
      "floor metric eigenvalues based on grid size and solution jitter");
  RSS(ref_metric_histogram(metric, ref_grid, "hess.tec"), "histogram");
  RSS(ref_metric_local_scale(metric, ref_grid, p_norm), "local scale lp norm");
  RSS(ref_metric_gradation_at_complexity(metric, ref_grid, gradation,
                                         target_complexity),
      "gradation at complexity");

  return REF_SUCCESS;
}